

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O1

OPJ_BOOL opj_jp2_read_header_procedure
                   (opj_jp2_t *jp2,opj_stream_private_t *stream,opj_event_mgr_t *p_manager)

{
  bool bVar1;
  OPJ_UINT32 OVar2;
  uint uVar3;
  int iVar4;
  OPJ_BYTE *pOVar5;
  OPJ_SIZE_T OVar6;
  OPJ_OFF_T OVar7;
  ulong uVar8;
  OPJ_BYTE *p_buffer;
  char *fmt;
  long lVar9;
  uint uVar10;
  long lVar11;
  uint local_64;
  opj_jp2_box_t box;
  OPJ_UINT32 local_44;
  OPJ_BYTE l_data_header [8];
  ulong new_size;
  
  if (stream == (opj_stream_private_t *)0x0) {
    __assert_fail("stream != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0x845,
                  "OPJ_BOOL opj_jp2_read_header_procedure(opj_jp2_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (jp2 == (opj_jp2_t *)0x0) {
    __assert_fail("jp2 != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0x846,
                  "OPJ_BOOL opj_jp2_read_header_procedure(opj_jp2_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_manager == (opj_event_mgr_t *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0x847,
                  "OPJ_BOOL opj_jp2_read_header_procedure(opj_jp2_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  pOVar5 = (OPJ_BYTE *)opj_calloc(1,0x400);
  if (pOVar5 == (OPJ_BYTE *)0x0) {
    opj_event_msg(p_manager,1,"Not enough memory to handle jpeg2000 file header\n");
    return 0;
  }
  local_64 = 0x400;
  do {
    OVar6 = opj_stream_read_data(stream,l_data_header,8,p_manager);
    uVar3 = (uint)OVar6;
    bVar1 = true;
    if (uVar3 == 8) {
      opj_read_bytes_LE(l_data_header,&box.length,4);
      opj_read_bytes_LE(l_data_header + 4,&box.type,4);
      if (box.length == 1) {
        OVar6 = opj_stream_read_data(stream,l_data_header,8,p_manager);
        iVar4 = (int)OVar6;
        if (iVar4 != 0) {
          if (iVar4 == 8) {
            opj_read_bytes_LE(l_data_header,&local_44,4);
            if (local_44 == 0) {
              opj_read_bytes_LE(l_data_header + 4,&box.length,4);
              uVar3 = 0x10;
              goto LAB_00119a62;
            }
            opj_event_msg(p_manager,1,"Cannot handle box sizes higher than 2^32\n");
            uVar3 = 0x10;
          }
          else {
            uVar3 = iVar4 + 8;
          }
        }
      }
      else {
        if (box.length == 0) {
          OVar7 = opj_stream_get_number_byte_left(stream);
          if (0xfffffff7 < OVar7) {
            opj_event_msg(p_manager,1,"Cannot handle box sizes higher than 2^32\n");
            goto LAB_00119a65;
          }
          box.length = (int)OVar7 + 8;
          if (OVar7 + 8U != (ulong)box.length) {
            __assert_fail("(OPJ_OFF_T)box->length == bleft + 8",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/jp2.c"
                          ,0x1ec,
                          "OPJ_BOOL opj_jp2_read_boxhdr(opj_jp2_box_t *, OPJ_UINT32 *, opj_stream_private_t *, opj_event_mgr_t *)"
                         );
          }
        }
LAB_00119a62:
        bVar1 = false;
      }
    }
LAB_00119a65:
    if (bVar1) {
LAB_00119d5e:
      opj_free(pOVar5);
      return 1;
    }
    if (box.type == 0x6a703263) {
      if ((jp2->jp2_state & 4) != 0) {
        jp2->jp2_state = jp2->jp2_state | 8;
        goto LAB_00119d5e;
      }
      fmt = "bad placed jpeg codestream\n";
LAB_00119d3b:
      opj_event_msg(p_manager,1,fmt);
LAB_00119d51:
      opj_free(pOVar5);
      return 0;
    }
    if (box.length == 0) {
      fmt = "Cannot handle box of undefined sizes\n";
      goto LAB_00119d3b;
    }
    uVar10 = box.length - uVar3;
    new_size = (ulong)uVar10;
    if (box.length < uVar3) {
      opj_event_msg(p_manager,1,"invalid box size %d (%x)\n",(ulong)box.length,(ulong)box.type);
      goto LAB_00119d51;
    }
    lVar11 = 0;
    do {
      if (*(OPJ_UINT32 *)((long)&jp2_header[0].id + lVar11) == box.type) {
        lVar11 = (long)&jp2_header[0].id + lVar11;
        goto LAB_00119abf;
      }
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0x30);
    lVar11 = 0;
LAB_00119abf:
    lVar9 = 0;
    do {
      if (*(OPJ_UINT32 *)((long)&jp2_img_header[0].id + lVar9) == box.type) {
        lVar9 = (long)&jp2_img_header[0].id + lVar9;
        goto LAB_00119ad8;
      }
      lVar9 = lVar9 + 0x10;
    } while (lVar9 != 0x60);
    lVar9 = 0;
LAB_00119ad8:
    if (lVar11 == 0 && lVar9 == 0) {
      uVar3 = jp2->jp2_state;
      if ((uVar3 & 1) == 0) {
        fmt = "Malformed JP2 file format: first box must be JPEG 2000 signature box\n";
      }
      else {
        if ((uVar3 & 2) != 0) {
          jp2->jp2_state = uVar3 | 0x7fffffff;
          uVar8 = opj_stream_skip(stream,new_size,p_manager);
          goto joined_r0x00119bb0;
        }
        fmt = "Malformed JP2 file format: second box must be file type box\n";
      }
      goto LAB_00119d3b;
    }
    if ((lVar11 == 0) &&
       (opj_event_msg(p_manager,2,"Found a misplaced \'%c%c%c%c\' box outside jp2h box\n",
                      (ulong)(box.type >> 0x18),(ulong)(box.type >> 0x10 & 0xff),
                      (ulong)(box.type >> 8 & 0xff),(ulong)(box.type & 0xff)), lVar11 = lVar9,
       (jp2->jp2_state & 4) == 0)) {
      opj_event_msg(p_manager,2,
                    "JPEG2000 Header box not read yet, \'%c%c%c%c\' box will be ignored\n",
                    (ulong)(box.type >> 0x18),(ulong)(box.type >> 0x10 & 0xff),
                    (ulong)(box.type >> 8 & 0xff),(ulong)(box.type & 0xff));
      jp2->jp2_state = jp2->jp2_state | 0x7fffffff;
      uVar8 = opj_stream_skip(stream,new_size,p_manager);
joined_r0x00119bb0:
      if (uVar8 != new_size) {
        fmt = "Problem with skipping JPEG2000 box, stream error\n";
        goto LAB_00119d3b;
      }
    }
    else {
      OVar7 = opj_stream_get_number_byte_left(stream);
      OVar2 = box.length;
      if (OVar7 < (long)new_size) {
        OVar7 = opj_stream_get_number_byte_left(stream);
        opj_event_msg(p_manager,1,
                      "Invalid box size %d for box \'%c%c%c%c\'. Need %d bytes, %d bytes remaining \n"
                      ,OVar2,(ulong)(box.type >> 0x18),(ulong)(box.type >> 0x10 & 0xff),
                      (ulong)(box.type >> 8 & 0xff),(ulong)(box.type & 0xff),new_size,OVar7);
        goto LAB_00119d51;
      }
      p_buffer = pOVar5;
      if ((local_64 < uVar10) &&
         (p_buffer = (OPJ_BYTE *)opj_realloc(pOVar5,new_size), local_64 = uVar10,
         p_buffer == (OPJ_BYTE *)0x0)) {
        opj_free(pOVar5);
        opj_event_msg(p_manager,1,"Not enough memory to handle jpeg2000 box\n");
        return 0;
      }
      OVar6 = opj_stream_read_data(stream,p_buffer,new_size,p_manager);
      pOVar5 = p_buffer;
      if (uVar10 != (uint)OVar6) {
        opj_event_msg(p_manager,1,"Problem with reading JPEG2000 box, stream error\n");
        goto LAB_00119d51;
      }
      iVar4 = (**(code **)(lVar11 + 8))(jp2,p_buffer,new_size,p_manager);
      if (iVar4 == 0) {
        opj_free(p_buffer);
        return 0;
      }
    }
  } while( true );
}

Assistant:

static OPJ_BOOL opj_jp2_read_header_procedure(  opj_jp2_t *jp2,
                                                opj_stream_private_t *stream,
                                                opj_event_mgr_t * p_manager
                                                )
{
	opj_jp2_box_t box;
	OPJ_UINT32 l_nb_bytes_read;
	const opj_jp2_header_handler_t * l_current_handler;
	const opj_jp2_header_handler_t * l_current_handler_misplaced;
	OPJ_UINT32 l_last_data_size = OPJ_BOX_SIZE;
	OPJ_UINT32 l_current_data_size;
	OPJ_BYTE * l_current_data = 00;

	/* preconditions */
	assert(stream != 00);
	assert(jp2 != 00);
	assert(p_manager != 00);

	l_current_data = (OPJ_BYTE*)opj_calloc(1,l_last_data_size);

	if (l_current_data == 00) {
		opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to handle jpeg2000 file header\n");
		return OPJ_FALSE;
	}

	while (opj_jp2_read_boxhdr(&box,&l_nb_bytes_read,stream,p_manager)) {
		/* is it the codestream box ? */
		if (box.type == JP2_JP2C) {
			if (jp2->jp2_state & JP2_STATE_HEADER) {
				jp2->jp2_state |= JP2_STATE_CODESTREAM;
				opj_free(l_current_data);
				return OPJ_TRUE;
			}
			else {
				opj_event_msg(p_manager, EVT_ERROR, "bad placed jpeg codestream\n");
				opj_free(l_current_data);
				return OPJ_FALSE;
			}
		}
		else if	(box.length == 0) {
			opj_event_msg(p_manager, EVT_ERROR, "Cannot handle box of undefined sizes\n");
			opj_free(l_current_data);
			return OPJ_FALSE;
		}
		/* testcase 1851.pdf.SIGSEGV.ce9.948 */
		else if (box.length < l_nb_bytes_read) {
			opj_event_msg(p_manager, EVT_ERROR, "invalid box size %d (%x)\n", box.length, box.type);
			opj_free(l_current_data);
			return OPJ_FALSE;
		}

		l_current_handler = opj_jp2_find_handler(box.type);
		l_current_handler_misplaced = opj_jp2_img_find_handler(box.type);
		l_current_data_size = box.length - l_nb_bytes_read;

		if ((l_current_handler != 00) || (l_current_handler_misplaced != 00)) {
			if (l_current_handler == 00) {
				opj_event_msg(p_manager, EVT_WARNING, "Found a misplaced '%c%c%c%c' box outside jp2h box\n", (OPJ_BYTE)(box.type>>24), (OPJ_BYTE)(box.type>>16), (OPJ_BYTE)(box.type>>8), (OPJ_BYTE)(box.type>>0));
				if (jp2->jp2_state & JP2_STATE_HEADER) {
					/* read anyway, we already have jp2h */
					l_current_handler = l_current_handler_misplaced;
				} else {
					opj_event_msg(p_manager, EVT_WARNING, "JPEG2000 Header box not read yet, '%c%c%c%c' box will be ignored\n", (OPJ_BYTE)(box.type>>24), (OPJ_BYTE)(box.type>>16), (OPJ_BYTE)(box.type>>8), (OPJ_BYTE)(box.type>>0));
					jp2->jp2_state |= JP2_STATE_UNKNOWN;
					if (opj_stream_skip(stream,l_current_data_size,p_manager) != l_current_data_size) {
							opj_event_msg(p_manager, EVT_ERROR, "Problem with skipping JPEG2000 box, stream error\n");
							opj_free(l_current_data);
							return OPJ_FALSE;
					}
					continue;
				}
			}
			if ((OPJ_OFF_T)l_current_data_size > opj_stream_get_number_byte_left(stream)) {
				/* do not even try to malloc if we can't read */
				opj_event_msg(p_manager, EVT_ERROR, "Invalid box size %d for box '%c%c%c%c'. Need %d bytes, %d bytes remaining \n", box.length, (OPJ_BYTE)(box.type>>24), (OPJ_BYTE)(box.type>>16), (OPJ_BYTE)(box.type>>8), (OPJ_BYTE)(box.type>>0), l_current_data_size, (OPJ_UINT32)opj_stream_get_number_byte_left(stream));
				opj_free(l_current_data);
				return OPJ_FALSE;
			}
			if (l_current_data_size > l_last_data_size) {
				OPJ_BYTE* new_current_data = (OPJ_BYTE*)opj_realloc(l_current_data,l_current_data_size);
				if (!new_current_data) {
					opj_free(l_current_data);
                    opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to handle jpeg2000 box\n");
					return OPJ_FALSE;
				}
                l_current_data = new_current_data;
				l_last_data_size = l_current_data_size;
			}

			l_nb_bytes_read = (OPJ_UINT32)opj_stream_read_data(stream,l_current_data,l_current_data_size,p_manager);
			if (l_nb_bytes_read != l_current_data_size) {
				opj_event_msg(p_manager, EVT_ERROR, "Problem with reading JPEG2000 box, stream error\n");
                opj_free(l_current_data);                
				return OPJ_FALSE;
			}

			if (! l_current_handler->handler(jp2,l_current_data,l_current_data_size,p_manager)) {
				opj_free(l_current_data);
				return OPJ_FALSE;
			}
		}
		else {
			if (!(jp2->jp2_state & JP2_STATE_SIGNATURE)) {
				opj_event_msg(p_manager, EVT_ERROR, "Malformed JP2 file format: first box must be JPEG 2000 signature box\n");
				opj_free(l_current_data);
				return OPJ_FALSE;
			}
			if (!(jp2->jp2_state & JP2_STATE_FILE_TYPE)) {
				opj_event_msg(p_manager, EVT_ERROR, "Malformed JP2 file format: second box must be file type box\n");
				opj_free(l_current_data);
				return OPJ_FALSE;
			}
			jp2->jp2_state |= JP2_STATE_UNKNOWN;
			if (opj_stream_skip(stream,l_current_data_size,p_manager) != l_current_data_size) {
				opj_event_msg(p_manager, EVT_ERROR, "Problem with skipping JPEG2000 box, stream error\n");
				opj_free(l_current_data);
				return OPJ_FALSE;
			}
		}
	}

	opj_free(l_current_data);

	return OPJ_TRUE;
}